

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

action Search::single_prediction_notLDF
                 (search_private *priv,example *ec,int policy,action *allowed_actions,
                 size_t allowed_actions_cnt,float *allowed_actions_cost,float *a_cost,
                 action override_action)

{
  polylabel *ppVar1;
  float fVar2;
  action aVar3;
  int iVar4;
  wclass *pwVar5;
  BaseTask *pBVar6;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar7;
  stringstream *psVar8;
  _func_void_int_string_v_array<char> *p_Var9;
  wclass *pwVar10;
  size_t sVar11;
  label_t lVar12;
  v_array<char> vVar13;
  float fVar14;
  float fVar15;
  bool bVar16;
  SearchState SVar17;
  polylabel *ppVar18;
  single_learner *this;
  ostream *poVar19;
  vw_exception *this_00;
  float *pfVar20;
  long lVar21;
  size_t k_1;
  ulong uVar22;
  float *pfVar23;
  byte bVar24;
  size_t k;
  long lVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  action local_250;
  undefined4 uStack_24c;
  float local_248;
  undefined4 uStack_244;
  v_array<Search::action_cache> *this_cache;
  v_array<unsigned_int> *local_238;
  vw *local_230;
  polylabel old_label;
  string local_1f8 [32];
  string local_1d8;
  pair<COST_SENSITIVE::wclass_&,_bool> p;
  ostream local_1a8;
  
  uStack_24c = (undefined4)((ulong)allowed_actions_cost >> 0x20);
  local_230 = priv->all;
  ppVar1 = &ec->l;
  old_label.cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
  old_label.multi = (ec->l).multi;
  old_label.cs.costs._end = (ec->l).cs.costs._end;
  old_label.cs.costs.end_array = (ec->l).cs.costs.end_array;
  old_label.cs.costs.erase_count = (ec->l).cs.costs.erase_count;
  bVar16 = need_memo_foreach_action(priv);
  bVar24 = 1;
  if (bVar16) {
LAB_0011f2bd:
    ppVar18 = allowed_actions_to_ld(priv,1,allowed_actions,allowed_actions_cnt,allowed_actions_cost)
    ;
    pwVar5 = (ppVar18->cs).costs._end;
    pwVar10 = (ppVar18->cs).costs.end_array;
    sVar11 = (ppVar18->cs).costs.erase_count;
    ppVar1->multi = ppVar18->multi;
    (ec->l).cs.costs._end = pwVar5;
    (ec->l).cs.costs.end_array = pwVar10;
    (ec->l).cs.costs.erase_count = sVar11;
    (ec->l).cb_eval.event.costs.erase_count = (ppVar18->cb_eval).event.costs.erase_count;
  }
  else {
    if (priv->metaoverride != (BaseTask *)0x0) {
      if ((override_action == 0xffffffff) &&
         (priv->metaoverride->_foreach_action ==
          (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) goto LAB_0011f87c;
      goto LAB_0011f2bd;
    }
    if (override_action != 0xffffffff) goto LAB_0011f2bd;
LAB_0011f87c:
    bVar24 = priv->active_csoaa;
    if (allowed_actions_cnt != 0 || (bVar24 & 1) != 0) goto LAB_0011f2bd;
    lVar12 = (label_t)(priv->empty_cs_label).costs._begin;
    pwVar5 = (priv->empty_cs_label).costs._end;
    sVar11 = (priv->empty_cs_label).costs.erase_count;
    (ec->l).cs.costs.end_array = (priv->empty_cs_label).costs.end_array;
    (ec->l).cs.costs.erase_count = sVar11;
    ppVar1->multi = lVar12;
    (ec->l).cs.costs._end = pwVar5;
    bVar24 = 0;
  }
  this = LEARNER::as_singleline<char,char>(priv->base_learner);
  LEARNER::learner<char,_example>::predict(this,ec,(long)policy);
  local_250 = override_action;
  if (override_action == 0xffffffff) {
    local_250 = (ec->pred).multiclass;
  }
  *a_cost = ec->partial_prediction;
  if ((bVar24 & 1) != 0) {
    pwVar5 = (ec->l).cs.costs._begin;
    lVar25 = (long)(ec->l).cs.costs._end - (long)pwVar5 >> 4;
    pfVar20 = &pwVar5->partial_prediction;
    lVar21 = lVar25;
    fVar27 = 3.4028235e+38;
    while (bVar16 = lVar21 != 0, lVar21 = lVar21 + -1, bVar16) {
      pfVar23 = pfVar20 + 1;
      if (priv->cb_learner == false) {
        pfVar23 = pfVar20;
      }
      fVar28 = *pfVar23;
      if (fVar27 <= *pfVar23) {
        fVar28 = fVar27;
      }
      pfVar20 = pfVar20 + 4;
      fVar27 = fVar28;
    }
    local_238 = (v_array<unsigned_int> *)CONCAT44(local_238._4_4_,fVar27);
    this_cache = (v_array<Search::action_cache> *)0x0;
    bVar16 = need_memo_foreach_action(priv);
    if (override_action == 0xffffffff && bVar16) {
      this_cache = (v_array<Search::action_cache> *)operator_new(0x20);
      this_cache->_begin = (action_cache *)0x0;
      this_cache->_end = (action_cache *)0x0;
      this_cache->end_array = (action_cache *)0x0;
      this_cache->erase_count = 0;
    }
    lVar21 = 8;
    while (bVar16 = lVar25 != 0, lVar25 = lVar25 + -1, bVar16) {
      pwVar5 = (ppVar1->cs).costs._begin;
      pfVar20 = &pwVar5->x;
      if (priv->cb_learner != false) {
        pfVar20 = (float *)&pwVar5->class_index;
      }
      aVar3 = *(action *)((long)pwVar5 + lVar21 + -4);
      fVar27 = *(float *)((long)pfVar20 + lVar21);
      pBVar6 = priv->metaoverride;
      if ((pBVar6 != (BaseTask *)0x0) &&
         (pBVar6->_foreach_action != (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) {
        (*pBVar6->_foreach_action)
                  (pBVar6->sch,priv->t - 1,local_238._0_4_,aVar3,aVar3 == local_250,fVar27);
        local_248 = fVar27;
      }
      if (aVar3 == override_action) {
        *a_cost = fVar27;
      }
      if (this_cache != (v_array<Search::action_cache> *)0x0) {
        p.first = (wclass *)CONCAT44(aVar3,(int)local_238);
        p.second = aVar3 == local_250;
        p._12_4_ = fVar27;
        v_array<Search::action_cache>::push_back(this_cache,(action_cache *)&p);
      }
      lVar21 = lVar21 + 0x10;
    }
    if (this_cache != (v_array<Search::action_cache> *)0x0) {
      v_array<v_array<Search::action_cache>_*>::push_back(&priv->memo_foreach_action,&this_cache);
    }
  }
  SVar17 = priv->state;
  if ((SVar17 != INIT_TRAIN) || (-1.0 < priv->subsample_timesteps)) {
LAB_0011f5b2:
    if (SVar17 == INIT_TRAIN) goto LAB_0011f5bb;
  }
  else {
    pwVar5 = (ec->l).cs.costs._begin;
    lVar21 = (long)(ec->l).cs.costs._end - (long)pwVar5 >> 4;
    pfVar20 = &pwVar5->partial_prediction;
    fVar27 = 3.4028235e+38;
    fVar28 = 3.4028235e+38;
    while (bVar16 = lVar21 != 0, lVar21 = lVar21 + -1, bVar16) {
      pfVar23 = pfVar20 + 1;
      if (priv->cb_learner == false) {
        pfVar23 = pfVar20;
      }
      fVar2 = *pfVar23;
      fVar14 = fVar27;
      fVar15 = fVar2;
      if ((fVar27 <= fVar2) && (fVar14 = fVar2, fVar15 = fVar27, fVar28 <= fVar2)) {
        fVar14 = fVar28;
      }
      fVar27 = fVar15;
      fVar28 = fVar14;
      pfVar20 = pfVar20 + 4;
    }
    if (fVar28 < 3.4028235e+38) {
      p._8_8_ = priv->meta_t + priv->t;
      p.first = (wclass *)CONCAT44(p.first._4_4_,fVar28 - fVar27);
      v_array<std::pair<float,_unsigned_long>_>::push_back
                (&priv->active_uncertainty,(pair<float,_unsigned_long> *)&p);
      SVar17 = priv->state;
      goto LAB_0011f5b2;
    }
LAB_0011f5bb:
    if (priv->active_csoaa != true) goto LAB_0011f828;
    if (priv->cb_learner == true) {
      std::__cxx11::stringstream::stringstream((stringstream *)&p);
      std::operator<<(&local_1a8,"cannot use active_csoaa with cb learning");
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0x496,&local_1d8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_238 = (v_array<unsigned_int> *)&ec->pred;
    uVar22 = (priv->t + priv->meta_t) - 1;
    while (pvVar7 = (priv->active_known)._begin,
          (ulong)((long)(priv->active_known)._end - (long)pvVar7 >> 5) <= uVar22) {
      local_1a8._vptr_basic_ostream = (_func_int **)0x0;
      local_1a8._8_8_ = 0;
      p.first = (wclass *)0x0;
      p.second = false;
      p._9_7_ = 0;
      v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::push_back
                (&priv->active_known,(v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)&p);
      pvVar7 = (priv->active_known)._end;
      pvVar7[-1].end_array = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
      pvVar7[-1].erase_count = 0;
      pvVar7[-1]._begin = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
      pvVar7[-1]._end = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
    }
    v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::clear(pvVar7 + uVar22);
    lVar21 = 0;
    uVar26 = 0;
    while( true ) {
      uStack_244 = (undefined4)((ulong)ec >> 0x20);
      local_248 = SUB84(ec,0);
      pwVar5 = (ec->l).cs.costs._begin;
      if ((ulong)((long)(ec->l).cs.costs._end - (long)pwVar5 >> 4) <= uVar26) break;
      bVar16 = v_array_contains<unsigned_int>
                         (local_238,*(uint *)((long)&pwVar5->class_index + lVar21));
      p.second = bVar16;
      p.first = (wclass *)((long)&pwVar5->x + lVar21);
      v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::push_back
                ((priv->active_known)._begin + uVar22,&p);
      uVar26 = uVar26 + 1;
      lVar21 = lVar21 + 0x10;
    }
    SVar17 = priv->state;
  }
  if ((SVar17 == INIT_TEST) && (0 < local_230->raw_prediction)) {
    psVar8 = priv->rawOutputStringStream;
    std::__cxx11::string::string((string *)&p,"",(allocator *)&this_cache);
    std::__cxx11::stringbuf::str((string *)(psVar8 + 0x18));
    lVar21 = 8;
    std::__cxx11::string::~string((string *)&p);
    for (uVar22 = 0;
        uVar22 < (ulong)((long)(ec->l).cs.costs._end - (long)(ec->l).cs.costs._begin >> 4);
        uVar22 = uVar22 + 1) {
      if (uVar22 != 0) {
        std::operator<<((ostream *)(priv->rawOutputStringStream + 0x10),' ');
      }
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)(priv->rawOutputStringStream + 0x10));
      poVar19 = std::operator<<(poVar19,':');
      pwVar5 = (ppVar1->cs).costs._begin;
      pfVar20 = &pwVar5->x;
      if (priv->cb_learner != false) {
        pfVar20 = (float *)&pwVar5->class_index;
      }
      std::ostream::operator<<(poVar19,*(float *)((long)pfVar20 + lVar21));
      lVar21 = lVar21 + 0x10;
    }
    p_Var9 = local_230->print_text;
    iVar4 = local_230->raw_prediction;
    std::__cxx11::stringbuf::str();
    vVar13._end._0_4_ = local_250;
    vVar13._begin = (char *)ppVar1;
    vVar13._end._4_4_ = uStack_24c;
    vVar13.end_array._0_4_ = local_248;
    vVar13.end_array._4_4_ = uStack_244;
    vVar13.erase_count = (size_t)this_cache;
    (*p_Var9)(iVar4,(string)ec->tag,vVar13);
    std::__cxx11::string::~string(local_1f8);
  }
LAB_0011f828:
  (ec->l).cb_eval.event.costs.erase_count = old_label.cb_eval.event.costs.erase_count;
  (ec->l).cs.costs.end_array = old_label.cs.costs.end_array;
  (ec->l).cs.costs.erase_count = old_label.cs.costs.erase_count;
  ppVar1->multi = old_label.multi;
  (ec->l).cs.costs._end = old_label.cs.costs._end;
  priv->total_predictions_made = priv->total_predictions_made + 1;
  priv->num_features = priv->num_features + ec->num_features;
  return local_250;
}

Assistant:

action single_prediction_notLDF(search_private& priv, example& ec, int policy, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, float& a_cost,
    action override_action)  // if override_action != -1, then we return it as the action and a_cost is set to the
                             // appropriate cost for that action
{
  vw& all = *priv.all;
  polylabel old_label = ec.l;
  bool need_partial_predictions = need_memo_foreach_action(priv) ||
      (priv.metaoverride && priv.metaoverride->_foreach_action) || (override_action != (action)-1) || priv.active_csoaa;
  if ((allowed_actions_cnt > 0) || need_partial_predictions)
    ec.l = allowed_actions_to_ld(priv, 1, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
  else
    ec.l.cs = priv.empty_cs_label;

  cdbg << "allowed_actions_cnt=" << allowed_actions_cnt << ", ec.l = [";
  for (size_t i = 0; i < ec.l.cs.costs.size(); i++)
    cdbg << ' ' << ec.l.cs.costs[i].class_index << ':' << ec.l.cs.costs[i].x;
  cdbg << " ]" << endl;

  as_singleline(priv.base_learner)->predict(ec, policy);

  uint32_t act = ec.pred.multiclass;
  cdbg << "a=" << act << " from";
  if (allowed_actions)
  {
    for (size_t ii = 0; ii < allowed_actions_cnt; ii++) cdbg << ' ' << allowed_actions[ii];
  }
  cdbg << endl;
  a_cost = ec.partial_prediction;
  cdbg << "a_cost = " << a_cost << endl;

  if (override_action != (action)-1)
    act = override_action;

  if (need_partial_predictions)
  {
    size_t K = cs_get_costs_size(priv.cb_learner, ec.l);
    float min_cost = FLT_MAX;
    for (size_t k = 0; k < K; k++)
    {
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (cost < min_cost)
        min_cost = cost;
    }
    v_array<action_cache>* this_cache = nullptr;
    if (need_memo_foreach_action(priv) && (override_action == (action)-1))
    {
      this_cache = new v_array<action_cache>();
      *this_cache = v_init<action_cache>();
    }
    for (size_t k = 0; k < K; k++)
    {
      action cl = cs_get_cost_index(priv.cb_learner, ec.l, k);
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (priv.metaoverride && priv.metaoverride->_foreach_action)
        priv.metaoverride->_foreach_action(*priv.metaoverride->sch, priv.t - 1, min_cost, cl, cl == act, cost);
      if (override_action == cl)
        a_cost = cost;
      if (this_cache)
        this_cache->push_back(action_cache(min_cost, cl, cl == act, cost));
    }
    if (this_cache)
    {
      assert(priv.memo_foreach_action.size() == priv.meta_t + priv.t - 1);
      priv.memo_foreach_action.push_back(this_cache);
      cdbg << "memo_foreach_action[" << priv.meta_t + priv.t - 1 << "] = " << this_cache << endl;
    }
  }

  if ((priv.state == INIT_TRAIN) && (priv.subsample_timesteps <= -1))  // active learning
  {
    size_t K = cs_get_costs_size(priv.cb_learner, ec.l);
    float min_cost = FLT_MAX, min_cost2 = FLT_MAX;
    for (size_t k = 0; k < K; k++)
    {
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (cost < min_cost)
      {
        min_cost2 = min_cost;
        min_cost = cost;
      }
      else if (cost < min_cost2)
      {
        min_cost2 = cost;
      }
    }
    if (min_cost2 < FLT_MAX)
      priv.active_uncertainty.push_back(make_pair(min_cost2 - min_cost, priv.t + priv.meta_t));
  }
  if ((priv.state == INIT_TRAIN) && priv.active_csoaa)
  {
    if (priv.cb_learner)
      THROW("cannot use active_csoaa with cb learning");
    size_t cur_t = priv.t + priv.meta_t - 1;
    while (priv.active_known.size() <= cur_t)
    {
      priv.active_known.push_back(v_array<pair<CS::wclass&, bool>>());
      priv.active_known[priv.active_known.size() - 1] = v_init<pair<CS::wclass&, bool>>();
      cdbg << "active_known length now " << priv.active_known.size() << endl;
    }
    priv.active_known[cur_t].clear();
    assert(ec.l.cs.costs.size() > 0);
    for (size_t k = 0; k < ec.l.cs.costs.size(); k++)
    {
      /* priv.active_known[cur_t].push_back( ec.l.cs.costs[k].pred_is_certain
                                          ? ec.l.cs.costs[k].partial_prediction
                                          : FLT_MAX );
                                          cdbg << "active_known[" << cur_t << "][" << (priv.active_known[cur_t].size() -
         1) << "] = certain=" << ec.l.cs.costs[k].pred_is_certain << ", cost=" << ec.l.cs.costs[k].partial_prediction <<
         "}" << endl; */
      CS::wclass& wc = ec.l.cs.costs[k];
      // Get query_needed from pred
      bool query_needed = v_array_contains(ec.pred.multilabels.label_v, wc.class_index);
      pair<CS::wclass&, bool> p = {wc, query_needed};
      // Push into active_known[cur_t] with wc
      priv.active_known[cur_t].push_back(p);
      // cdbg << "active_known[" << cur_t << "][" << (priv.active_known[cur_t].size() - 1) << "] = " << wc.class_index
      // << ':' << wc.x << " pp=" << wc.partial_prediction << " query_needed=" << wc.query_needed << " max_pred=" <<
      // wc.max_pred << " min_pred=" << wc.min_pred << " is_range_overlapped=" << wc.is_range_overlapped << "
      // is_range_large=" << wc.is_range_large << endl;
      // query_needed=" << ec.l.cs.costs[k].query_needed << ", cost=" << ec.l.cs.costs[k].partial_prediction << "}" <<
      // endl;
    }
  }

  // generate raw predictions if necessary
  if ((priv.state == INIT_TEST) && (all.raw_prediction > 0))
  {
    priv.rawOutputStringStream->str("");
    for (size_t k = 0; k < cs_get_costs_size(priv.cb_learner, ec.l); k++)
    {
      if (k > 0)
        (*priv.rawOutputStringStream) << ' ';
      (*priv.rawOutputStringStream) << cs_get_cost_index(priv.cb_learner, ec.l, k) << ':'
                                    << cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
    }
    all.print_text(all.raw_prediction, priv.rawOutputStringStream->str(), ec.tag);
  }

  ec.l = old_label;

  priv.total_predictions_made++;
  priv.num_features += ec.num_features;

  return act;
}